

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::addBasics(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  IString base;
  IString name;
  IString base_00;
  IString name_00;
  IString base_01;
  IString name_01;
  IString base_02;
  IString name_02;
  IString base_03;
  IString name_03;
  IString base_04;
  IString name_04;
  IString base_05;
  IString name_05;
  IString base_06;
  IString name_06;
  IString base_07;
  IString name_07;
  IString base_08;
  IString name_08;
  IString view;
  IString name_09;
  IString view_00;
  IString name_10;
  IString view_01;
  IString name_11;
  IString view_02;
  IString name_12;
  IString view_03;
  IString name_13;
  IString view_04;
  IString name_14;
  IString view_05;
  IString name_15;
  IString view_06;
  IString name_16;
  bool bVar1;
  anon_class_8_1_ba1d35e2 local_130;
  anon_class_8_1_ba1d35e2 addMath;
  anon_class_8_1_ba1d35e2 local_28;
  anon_class_8_1_ba1d35e2 addHeap;
  Module *wasm_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  
  addHeap.ast = (Ref *)wasm;
  this_local = (Wasm2JSBuilder *)ast.inst;
  bVar1 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&wasm->memories);
  if (!bVar1) {
    local_28.ast = (Ref *)&this_local;
    name_16.str._M_str = cashew::HEAPF64;
    name_16.str._M_len = cashew::HEAP8;
    view_06.str._M_str = ASM_FUNC;
    view_06.str._M_len = INT8ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_16,view_06);
    name_15.str._M_str = _getFunctionOrNull;
    name_15.str._M_len = cashew::HEAP16;
    view_05.str._M_str = _getLocalType;
    view_05.str._M_len = INT16ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_15,view_05);
    name_14.str._M_str = _str;
    name_14.str._M_len = cashew::HEAP32;
    view_04.str._M_str = _operator__;
    view_04.str._M_len = INT32ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_14,view_04);
    name_13.str._M_str = _containsPass;
    name_13.str._M_len = cashew::HEAPU8;
    view_03.str._M_str = _getByteSize;
    view_03.str._M_len = UINT8ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_13,view_03);
    name_12.str._M_str = _pthread_self;
    name_12.str._M_len = cashew::HEAPU16;
    view_02.str._M_str = cashew::DIV;
    view_02.str._M_len = UINT16ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_12,view_02);
    name_11.str._M_str = __Rb_tree_insert_and_rebalance;
    name_11.str._M_len = cashew::HEAPU32;
    view_01.str._M_str = cashew::LSHIFT;
    view_01.str._M_len = UINT32ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_11,view_01);
    name_10.str._M_str = _toString_abi_cxx11_;
    name_10.str._M_len = cashew::HEAPF32;
    view_00.str._M_str = EXPRESSION_RESULT;
    view_00.str._M_len = FLOAT32ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_10,view_00);
    addMath.ast = FLOAT64ARRAY;
    name_09.str._M_str = __ostringstream;
    name_09.str._M_len = (size_t)cashew::HEAPF64;
    view.str._M_str = _getShared;
    view.str._M_len = (size_t)FLOAT64ARRAY;
    addBasics::anon_class_8_1_ba1d35e2::operator()(&local_28,name_09,view);
  }
  local_130.ast = (Ref *)&this_local;
  name_08.str._M_str = cashew::CONDITIONAL;
  name_08.str._M_len = MATH_IMUL;
  base_08.str._M_str = _finalize;
  base_08.str._M_len = IMUL;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_08,base_08);
  name_07.str._M_str = _getExport;
  name_07.str._M_len = (size_t)cashew::MATH_FROUND;
  base_07.str._M_str = MATH_CEIL;
  base_07.str._M_len = FROUND;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_07,base_07);
  name_06.str._M_str = ABI::wasm2js::ATOMIC_WAIT_I32;
  name_06.str._M_len = MATH_ABS;
  base_06.str._M_str = ABI::wasm2js::SCRATCH_LOAD_I32;
  base_06.str._M_len = ABS;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_06,base_06);
  name_05.str._M_str = cashew::AND;
  name_05.str._M_len = MATH_CLZ32;
  base_05.str._M_str = cashew::MATH_FROUND;
  base_05.str._M_len = CLZ32;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_05,base_05);
  name_04.str._M_str = _getUnsharedBottom;
  name_04.str._M_len = MATH_MIN;
  base_04.str._M_str = _add;
  base_04.str._M_len = MIN;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_04,base_04);
  name_03.str._M_str = _compare;
  name_03.str._M_len = MATH_MAX;
  base_03.str._M_str = _insert;
  base_03.str._M_len = MAX;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_03,base_03);
  name_02.str._M_str = cashew::TOPLEVEL;
  name_02.str._M_len = MATH_FLOOR;
  base_02.str._M_str = cashew::SET;
  base_02.str._M_len = FLOOR;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_02,base_02);
  name_01.str._M_str = ___errno_location;
  name_01.str._M_len = (size_t)MATH_CEIL;
  base_01.str._M_str = _operator<<;
  base_01.str._M_len = CEIL;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_01,base_01);
  name_00.str._M_str = ABI::wasm2js::MEMORY_COPY;
  name_00.str._M_len = MATH_TRUNC;
  base_00.str._M_str = ___throw_invalid_argument;
  base_00.str._M_len = TRUNC;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name_00,base_00);
  name.str._M_str = _getRtl;
  name.str._M_len = MATH_SQRT;
  base.str._M_str = cashew::MOD;
  base.str._M_len = SQRT;
  addBasics::anon_class_8_1_ba1d35e2::operator()(&local_130,name,base);
  return;
}

Assistant:

void Wasm2JSBuilder::addBasics(Ref ast, Module* wasm) {
  if (!wasm->memories.empty()) {
    // heaps, var HEAP8 = new global.Int8Array(buffer); etc
    auto addHeap = [&](IString name, IString view) {
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);
      ValueBuilder::appendToVar(theVar,
                                name,
                                ValueBuilder::makeNew(ValueBuilder::makeCall(
                                  view, ValueBuilder::makeName(BUFFER))));
    };
    addHeap(HEAP8, INT8ARRAY);
    addHeap(HEAP16, INT16ARRAY);
    addHeap(HEAP32, INT32ARRAY);
    addHeap(HEAPU8, UINT8ARRAY);
    addHeap(HEAPU16, UINT16ARRAY);
    addHeap(HEAPU32, UINT32ARRAY);
    addHeap(HEAPF32, FLOAT32ARRAY);
    addHeap(HEAPF64, FLOAT64ARRAY);
  }
  // core asm.js imports
  auto addMath = [&](IString name, IString base) {
    Ref theVar = ValueBuilder::makeVar();
    ast->push_back(theVar);
    ValueBuilder::appendToVar(
      theVar, name, ValueBuilder::makeDot(ValueBuilder::makeName(MATH), base));
  };
  addMath(MATH_IMUL, IMUL);
  addMath(MATH_FROUND, FROUND);
  addMath(MATH_ABS, ABS);
  addMath(MATH_CLZ32, CLZ32);
  addMath(MATH_MIN, MIN);
  addMath(MATH_MAX, MAX);
  addMath(MATH_FLOOR, FLOOR);
  addMath(MATH_CEIL, CEIL);
  addMath(MATH_TRUNC, TRUNC);
  addMath(MATH_SQRT, SQRT);
}